

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O2

void ggml::cpu::aarch64::gemv<block_iq4_nl,4l,4l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  int j;
  long lVar3;
  long lVar4;
  long lVar5;
  int j_1;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  float afStack_a8 [6];
  long local_90;
  long local_88;
  long local_80;
  void *local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  float *local_58;
  void *local_50;
  void *local_48;
  ulong local_40;
  long local_38;
  
  uVar10 = n / 0x20;
  local_78 = vx;
  lVar11 = (long)vx + 8;
  local_50 = vy;
  local_80 = (long)(int)uVar10;
  local_88 = (long)vy + 0x12;
  local_40 = (ulong)(~((int)uVar10 >> 0x1f) & uVar10);
  local_90 = (long)(int)uVar10 * 0x48;
  local_70 = (ulong)(uint)(~(nc / 4 >> 0x1f) & nc / 4);
  uVar8 = 0;
  while (uVar8 != local_70) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      afStack_a8[lVar3] = 0.0;
    }
    local_58 = s;
    local_68 = uVar8;
    local_60 = lVar11;
    local_48 = (void *)(uVar8 * local_80 * 0x48 + (long)local_78);
    lVar3 = local_88;
    for (uVar8 = 0; pvVar2 = local_48, uVar8 != local_40; uVar8 = uVar8 + 1) {
      local_38 = lVar11;
      uVar10 = *(uint *)(&ggml_table_f32_f16 + (ulong)*(ushort *)((long)local_50 + uVar8 * 0x22) * 4
                        );
      lVar7 = lVar3;
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        lVar12 = lVar11;
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          iVar9 = 0;
          for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
            iVar9 = (int)*(char *)(lVar7 + -0x10 + lVar5) *
                    (int)kvalues_iq4nl[*(byte *)(lVar12 + lVar5) & 0xf] + iVar9 +
                    (int)*(char *)(lVar7 + lVar5) *
                    (int)kvalues_iq4nl[*(byte *)(lVar12 + lVar5) >> 4];
          }
          lVar12 = lVar12 + 4;
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)((float)iVar9 *
                                                 *(float *)(&ggml_table_f32_f16 +
                                                           (ulong)*(ushort *)
                                                                   ((long)pvVar2 +
                                                                   lVar6 * 2 + uVar8 * 0x48) * 4))),
                                   ZEXT416(uVar10),ZEXT416((uint)afStack_a8[lVar6]));
          afStack_a8[lVar6] = auVar1._0_4_;
        }
        lVar7 = lVar7 + 4;
        lVar11 = lVar11 + 0x10;
      }
      lVar3 = lVar3 + 0x22;
      lVar11 = local_38 + 0x48;
    }
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      local_58[lVar11] = afStack_a8[lVar11];
    }
    lVar11 = local_60 + local_90;
    s = local_58 + 4;
    uVar8 = local_68 + 1;
  }
  return;
}

Assistant:

void gemv<block_iq4_nl, 4, 4, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemv_iq4_nl_4x4_q8_0(n, s, bs, vx, vy, nr, nc);
}